

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O2

Span<char> absl::log_internal::EncodeMessageStart(uint64_t tag,uint64_t max_size,Span<char> *buf)

{
  uint64_t value;
  size_t size;
  size_t len;
  Span<char> SVar1;
  
  value = tag * 8 + 2;
  size = VarintSize(value);
  if (buf->len_ < max_size) {
    max_size = buf->len_;
  }
  len = VarintSize(max_size);
  if (buf->len_ < len + size) {
    Span<char>::remove_suffix(buf,buf->len_);
    SVar1 = (Span<char>)ZEXT816(0);
  }
  else {
    anon_unknown_1::EncodeRawVarint(value,size,buf);
    SVar1 = Span<char>::subspan(buf,0,len);
    anon_unknown_1::EncodeRawVarint(0,len,buf);
  }
  return SVar1;
}

Assistant:

ABSL_MUST_USE_RESULT absl::Span<char> EncodeMessageStart(
    uint64_t tag, uint64_t max_size, absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::kLengthDelimited);
  const size_t tag_type_size = VarintSize(tag_type);
  max_size = std::min<uint64_t>(max_size, buf->size());
  const size_t length_size = VarintSize(max_size);
  if (tag_type_size + length_size > buf->size()) {
    buf->remove_suffix(buf->size());
    return absl::Span<char>();
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  const absl::Span<char> ret = buf->subspan(0, length_size);
  EncodeRawVarint(0, length_size, buf);
  return ret;
}